

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

bool __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::operator==
          (SmallVector<wasm::Literal,_1UL> *this,SmallVector<wasm::Literal,_1UL> *other)

{
  const_reference this_00;
  const_reference pvVar1;
  ulong uVar2;
  ulong local_28;
  size_t i;
  SmallVector<wasm::Literal,_1UL> *other_local;
  SmallVector<wasm::Literal,_1UL> *this_local;
  
  if (this->usedFixed == other->usedFixed) {
    for (local_28 = 0; local_28 < this->usedFixed; local_28 = local_28 + 1) {
      this_00 = std::array<wasm::Literal,_1UL>::operator[](&this->fixed,local_28);
      pvVar1 = std::array<wasm::Literal,_1UL>::operator[](&other->fixed,local_28);
      uVar2 = ::wasm::Literal::operator!=(this_00,pvVar1);
      if ((uVar2 & 1) != 0) {
        return false;
      }
    }
    this_local._7_1_ = std::operator==(&this->flexible,&other->flexible);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const SmallVector<T, N>& other) const {
    if (usedFixed != other.usedFixed) {
      return false;
    }
    for (size_t i = 0; i < usedFixed; i++) {
      if (fixed[i] != other.fixed[i]) {
        return false;
      }
    }
    return flexible == other.flexible;
  }